

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

string * __thiscall Node::to_string_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  string *psVar5;
  _Rb_tree_node_base *p_Var6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  undefined1 uVar10;
  char *pcVar11;
  char *pcVar12;
  initializer_list<char> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string newLabel;
  string *str;
  set<char,_std::less<char>,_std::allocator<char>_> escapeChars;
  long *local_148 [2];
  long local_138 [2];
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_60;
  
  local_108 = &local_f8;
  local_100 = 0;
  local_f8 = 0;
  local_a8 = (long *)CONCAT17(local_a8._7_1_,0xa29283b227d7b);
  __l._M_len = 7;
  __l._M_array = (iterator)&local_a8;
  local_88 = __return_storage_ptr__;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)&local_60,__l,
             (less<char> *)&local_c8,(allocator_type *)&local_e8);
  sVar2 = (this->label)._M_string_length;
  if (sVar2 != 0) {
    pcVar12 = (this->label)._M_dataplus._M_p;
    pcVar11 = pcVar12 + sVar2;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    do {
      uVar10 = *pcVar12;
      if (uVar10 != 10) {
        p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        if (uVar10 == 0x23) {
          uVar10 = 0x5f;
        }
        while (((_Rb_tree_header *)p_Var6 != p_Var1 && ((char)p_Var6[1]._M_color != uVar10))) {
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        }
        if ((_Rb_tree_header *)p_Var6 != p_Var1) {
          std::__cxx11::string::push_back((char)&local_108);
        }
        std::__cxx11::string::push_back((char)&local_108);
      }
      pcVar12 = pcVar12 + 1;
    } while (pcVar12 != pcVar11);
  }
  pcVar3 = (this->name)._M_dataplus._M_p;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,pcVar3,pcVar3 + (this->name)._M_string_length);
  std::__cxx11::string::append((char *)local_148);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_148,(ulong)local_108);
  psVar5 = local_88;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_70 = *plVar8;
    lStack_68 = plVar7[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar8;
    local_80 = (long *)*plVar7;
  }
  local_78 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_128 = &local_118;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_118 = *plVar8;
    lStack_110 = plVar7[3];
  }
  else {
    local_118 = *plVar8;
    local_128 = (long *)*plVar7;
  }
  local_120 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_128,(ulong)(this->shape)._M_dataplus._M_p);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_d8 = *plVar8;
    lStack_d0 = plVar7[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *plVar8;
    local_e8 = (long *)*plVar7;
  }
  local_e0 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_b8 = *plVar8;
    lStack_b0 = plVar7[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar8;
    local_c8 = (long *)*plVar7;
  }
  local_c0 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c8,(ulong)(this->extra)._M_dataplus._M_p);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_98 = *plVar8;
    lStack_90 = plVar7[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar8;
    local_a8 = (long *)*plVar7;
  }
  local_a0 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    lVar4 = plVar7[3];
    (psVar5->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&psVar5->field_2 + 8) = lVar4;
  }
  else {
    (psVar5->_M_dataplus)._M_p = (pointer)*plVar7;
    (psVar5->field_2)._M_allocated_capacity = *psVar9;
  }
  psVar5->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_60);
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  return psVar5;
}

Assistant:

string Node::to_string() {
    std::string newLabel;
    std::set<char> escapeChars = {'{', '}', '"', ';', '(', ')', '\n'};
    int i = 0;
    for (char c: label) {
        i++;
        if (c == '\n')
            continue;
        if (c == '#')
            c = '_';
        if (std::find(escapeChars.begin(), escapeChars.end(), c) != escapeChars.end()) {
            newLabel += '\\';
        }
        newLabel += c;
    }
    string str = name + "[label=\"" + newLabel + "\" shape=" + shape + " " + extra + "]";
    return str;
}